

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O1

void __thiscall facenet::Reduction_A(facenet *this,pBox *input,pBox *output)

{
  pBox *outpBox;
  pBox *outpBox_00;
  pBox *outpBox_01;
  pBox *outpBox_02;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  pBox *Matrix;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  string filename;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  string local_178;
  string __str;
  mydataFmt *pointTeam [16];
  long dataNumber [16];
  
  outpBox = (pBox *)operator_new(0x38);
  (outpBox->super_String)._M_dataplus._M_p = (pointer)&(outpBox->super_String).field_2;
  (outpBox->super_String)._M_string_length = 0;
  (outpBox->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_00 = (pBox *)operator_new(0x38);
  (outpBox_00->super_String)._M_dataplus._M_p = (pointer)&(outpBox_00->super_String).field_2;
  (outpBox_00->super_String)._M_string_length = 0;
  (outpBox_00->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_01 = (pBox *)operator_new(0x38);
  (outpBox_01->super_String)._M_dataplus._M_p = (pointer)&(outpBox_01->super_String).field_2;
  (outpBox_01->super_String)._M_string_length = 0;
  (outpBox_01->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_02 = (pBox *)operator_new(0x38);
  (outpBox_02->super_String)._M_dataplus._M_p = (pointer)&(outpBox_02->super_String).field_2;
  (outpBox_02->super_String)._M_string_length = 0;
  (outpBox_02->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  Matrix = (pBox *)operator_new(0x38);
  (Matrix->super_String)._M_dataplus._M_p = (pointer)&(Matrix->super_String).field_2;
  (Matrix->super_String)._M_string_length = 0;
  (Matrix->super_String).field_2._M_local_buf[0] = '\0';
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  lVar1 = ConvAndFcInit(weight,0x180,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0x180);
  lVar2 = ConvAndFcInit(weight_00,0xc0,0x100,1,1,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0xc0);
  lVar3 = ConvAndFcInit(weight_01,0xc0,0xc0,3,1,0,0,0,0,0);
  BatchNormInit(beta_01,mean_01,var_01,0xc0);
  lVar4 = ConvAndFcInit(weight_02,0x100,0xc0,3,2,0,0,0,0,0);
  BatchNormInit(beta_02,mean_02,var_02,0x100);
  dataNumber[1] = 0x180;
  dataNumber[2] = 0x180;
  dataNumber[3] = 0x180;
  dataNumber[5] = 0xc0;
  dataNumber[6] = 0xc0;
  dataNumber[7] = 0xc0;
  dataNumber[9] = 0xc0;
  dataNumber[10] = 0xc0;
  dataNumber[0xb] = 0xc0;
  dataNumber[0xd] = 0x100;
  dataNumber[0xe] = 0x100;
  dataNumber[0xf] = 0x100;
  pointTeam[0] = weight->pdata;
  pointTeam[1] = beta->pdata;
  pointTeam[2] = mean->pdata;
  pointTeam[3] = var->pdata;
  pointTeam[4] = weight_00->pdata;
  pointTeam[5] = beta_00->pdata;
  pointTeam[6] = mean_00->pdata;
  pointTeam[7] = var_00->pdata;
  pointTeam[8] = weight_01->pdata;
  pointTeam[9] = beta_01->pdata;
  pointTeam[10] = mean_01->pdata;
  pointTeam[0xb] = var_01->pdata;
  pointTeam[0xc] = weight_02->pdata;
  pointTeam[0xd] = beta_02->pdata;
  pointTeam[0xe] = mean_02->pdata;
  pointTeam[0xf] = var_02->pdata;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  dataNumber[0] = lVar1;
  dataNumber[4] = lVar2;
  dataNumber[8] = lVar3;
  dataNumber[0xc] = lVar4;
  std::__cxx11::string::_M_construct((ulong)&__str,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,3,0x80);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x114020);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_188 = *plVar6;
    lStack_180 = plVar5[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar6;
    local_198 = (long *)*plVar5;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    filename.field_2._M_allocated_capacity = *psVar7;
    filename.field_2._8_8_ = plVar5[3];
  }
  else {
    filename.field_2._M_allocated_capacity = *psVar7;
    filename._M_dataplus._M_p = (pointer)*plVar5;
  }
  filename._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,filename._M_dataplus._M_p,
             filename._M_dataplus._M_p + filename._M_string_length);
  readData(&local_178,dataNumber,pointTeam,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  maxPoolingInit(input,Matrix,3,2,0);
  maxPooling(input,Matrix,3,2);
  convolutionInit(weight,input,outpBox);
  convolution(weight,input,outpBox);
  BatchNorm(outpBox,beta,mean,var);
  relu(outpBox,weight->pbias);
  convolutionInit(weight_00,input,outpBox_00);
  convolution(weight_00,input,outpBox_00);
  BatchNorm(outpBox_00,beta_00,mean_00,var_00);
  relu(outpBox_00,weight_00->pbias);
  convolutionInit(weight_01,outpBox_00,outpBox_01);
  convolution(weight_01,outpBox_00,outpBox_01);
  BatchNorm(outpBox_01,beta_01,mean_01,var_01);
  relu(outpBox_01,weight_01->pbias);
  convolutionInit(weight_02,outpBox_01,outpBox_02);
  convolution(weight_02,outpBox_01,outpBox_02);
  BatchNorm(outpBox_02,beta_02,mean_02,var_02);
  relu(outpBox_02,weight_02->pbias);
  conv_mergeInit(output,Matrix,outpBox,outpBox_02,(pBox *)0x0);
  conv_merge(output,Matrix,outpBox,outpBox_02,(pBox *)0x0);
  freepBox(outpBox);
  freepBox(outpBox_00);
  freepBox(outpBox_01);
  freepBox(outpBox_02);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freepBox(Matrix);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void facenet::Reduction_A(pBox *input, pBox *output) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;

    struct pBox *pooling1_out = new pBox;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 384, 256, 3, 2, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 384);

    long conv2 = ConvAndFcInit(conv2_wb, 192, 256, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 192);
    long conv3 = ConvAndFcInit(conv3_wb, 192, 192, 3, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 192);
    long conv4 = ConvAndFcInit(conv4_wb, 256, 192, 3, 2, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 256);
    long dataNumber[16] = {conv1, 384, 384, 384, conv2, 192, 192, 192, conv3, 192, 192, 192, conv4, 256, 256, 256};

//    mydataFmt *pointTeam[16] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata};
    mydataFmt *pointTeam[16] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata};
    string filename = "../model_" + to_string(Num) + "/Mixed_6a_list.txt";
    readData(filename, dataNumber, pointTeam, 16);

    maxPoolingInit(input, pooling1_out, 3, 2);
    // 17*17*256
    maxPooling(input, pooling1_out, 3, 2);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 17 x 17 x 384
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 35 x 35 x 192
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 35 x 35 x 192
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 17 x 17 x 256
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);
    conv_mergeInit(output, pooling1_out, conv1_out, conv4_out);
    //17×17×896
    conv_merge(output, pooling1_out, conv1_out, conv4_out);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);

    freepBox(pooling1_out);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
}